

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integration.cpp
# Opt level: O1

double * numerary::Numerary::integrate_simpson
                   (_func_double_double *f,double *a,double *b,double *eps)

{
  double *pdVar1;
  ulong uVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double local_98;
  double local_90;
  
  pdVar1 = (double *)operator_new__(0x10);
  dVar8 = *a;
  local_98 = 0.0;
  local_90 = 0.0;
  if (dVar8 < *b - *eps) {
    dVar9 = *b - dVar8;
    local_90 = 0.0;
    local_98 = 0.0;
    do {
      dVar3 = (*f)(dVar8);
      dVar4 = (*f)(dVar9 * 0.5 + dVar8);
      dVar5 = (*f)(dVar9 + dVar8);
      dVar6 = (*f)(dVar9 * 0.25 + dVar8);
      dVar7 = (*f)(dVar9 * 3.0 * 0.25 + dVar8);
      dVar6 = (dVar7 * 4.0 + dVar4 + dVar4 + dVar6 * 4.0 + dVar3 + dVar5) * (dVar9 / 12.0);
      dVar5 = ABS(((dVar4 * 4.0 + dVar3 + dVar5) * (dVar9 / -6.0) + dVar6) / 15.0);
      dVar4 = pow(dVar5 / *eps,0.2);
      dVar3 = *eps;
      if (dVar5 < dVar3) {
        local_90 = local_90 + dVar6;
        local_98 = local_98 + dVar5;
      }
      dVar6 = 10000.0;
      if (dVar4 <= 10000.0) {
        dVar6 = dVar4;
      }
      dVar4 = 0.0001;
      if (0.0001 <= dVar6) {
        dVar4 = dVar6;
      }
      dVar4 = (dVar9 * 0.95) / dVar4;
      dVar8 = (double)(~-(ulong)(dVar5 < dVar3) & (ulong)dVar8 |
                      (ulong)(dVar9 + dVar8) & -(ulong)(dVar5 < dVar3));
      dVar5 = *b;
      uVar2 = -(ulong)(dVar5 < dVar4 + dVar8);
      dVar9 = (double)(~uVar2 & (ulong)dVar4 | (ulong)(dVar5 - dVar8) & uVar2);
    } while (dVar8 < dVar5 - dVar3);
  }
  *pdVar1 = local_90;
  pdVar1[1] = local_98;
  return pdVar1;
}

Assistant:

double* Numerary::integrate_simpson(double (*f)(double), const double& a, const double& b, const double& eps)
    {
        double *return_value = new double[2], x = a, I_1, I_2, dt, chi, h = b - a, h_new, error = 0, ans = 0, fx_1, fx_2, fx_3;
        
        while (x < b - eps) {
            // Simpson's rule formulas
            fx_1 = f(x), fx_2 = f(x + h/2), fx_3 = f(x + h);
            I_1 = (h/6) * (fx_1 + 4*fx_2 + fx_3);
            I_2 = (h/12) * (fx_1 + 4*f(x + h/4) + 2*fx_2 + 4*f(x + (3*h)/4) + fx_3);

            dt = (I_2 - I_1) / 15;
            chi = pow(fabs(dt)/eps, 0.2);

            if(chi > 1e4) chi = 1e4;
            if(chi < 1e-4) chi = 1e-4;

            h_new = 0.95 * h / chi;

            if(fabs(dt) < eps) {
                x += h;
                ans += I_2;
                error += fabs(dt);
            }

            h = h_new;
            if(x + h > b) h = b - x;
        }

        return_value[0] = ans;
        return_value[1] = error;

        return return_value;
    }